

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O2

void cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(cmGeneratorTarget *target)

{
  cmMakefile *this;
  cmSourceFile *pcVar1;
  cmMakefile *pcVar2;
  cmMakefile *this_00;
  _Alloc_hider _Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  PolicyStatus PVar14;
  FileFormat FVar15;
  cmGlobalGenerator *pcVar16;
  mapped_type *pmVar17;
  string *psVar18;
  ostream *poVar19;
  cmLocalGenerator *pcVar20;
  cmGeneratorTarget *pcVar21;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var22;
  char **ppcVar23;
  _Base_ptr p_Var24;
  PolicyID id;
  pointer pbVar25;
  _Alloc_hider _Var26;
  pointer ppcVar27;
  char *pcVar28;
  char *pcVar29;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  value_type *__x;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar30;
  string infoFile;
  string configIncs;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uiFileFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uiFileOptions;
  cmNewLineStyle local_47c;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> uiFilesWithOptions;
  string qtMajorVersion;
  ScopePushPop varScope;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uicSkipList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccFileOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccFileFiles;
  string cfg;
  size_type *local_3a8;
  undefined8 local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mocSkipList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccOptionsTarget;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles_1;
  string autogenTargetName;
  string config;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configSuffix;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configUicOptions;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configMocDefines;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configMocIncludes;
  
  this = target->Target->Makefile;
  varScope.Makefile = this;
  cmMakefile::PushScope(this);
  config._M_dataplus._M_p = (pointer)&config.field_2;
  config._M_string_length = 0;
  config.field_2._M_local_buf[0] = '\0';
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&cfg,this,&configs,true);
  std::__cxx11::string::_M_assign((string *)&config);
  std::__cxx11::string::~string((string *)&cfg);
  if (configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&cfg,"",(allocator *)&configSuffix);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&configs,&cfg);
    std::__cxx11::string::~string((string *)&cfg);
  }
  configSuffix._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &configSuffix._M_t._M_impl.super__Rb_tree_header._M_header;
  configSuffix._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  configSuffix._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  configSuffix._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  configMocIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &configMocIncludes._M_t._M_impl.super__Rb_tree_header._M_header;
  configMocIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  configMocIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  configMocIncludes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  configMocDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &configMocDefines._M_t._M_impl.super__Rb_tree_header._M_header;
  configMocDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  configMocDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  configMocDefines._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  configSuffix._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       configSuffix._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  configMocDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       configMocDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  configMocIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       configMocIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar16 = cmGeneratorTarget::GetGlobalGenerator(target);
  iVar13 = (*pcVar16->_vptr_cmGlobalGenerator[0x1f])(pcVar16);
  if ((char)iVar13 != '\0') {
    for (pbVar25 = configs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar25 !=
        configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar25 = pbVar25 + 1) {
      std::operator+(&infoFile,"_",pbVar25);
      cmOutputConverter::EscapeForCMake(&cfg,&infoFile);
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&configSuffix,pbVar25);
      std::__cxx11::string::operator=((string *)pmVar17,(string *)&cfg);
      std::__cxx11::string::~string((string *)&cfg);
      std::__cxx11::string::~string((string *)&infoFile);
    }
  }
  std::__cxx11::string::string((string *)&cfg,"AUTOMOC",(allocator *)&infoFile);
  bVar4 = cmGeneratorTarget::GetPropertyAsBool(target,&cfg);
  std::__cxx11::string::~string((string *)&cfg);
  std::__cxx11::string::string((string *)&cfg,"AUTOUIC",(allocator *)&infoFile);
  bVar5 = cmGeneratorTarget::GetPropertyAsBool(target,&cfg);
  std::__cxx11::string::~string((string *)&cfg);
  std::__cxx11::string::string((string *)&cfg,"AUTORCC",(allocator *)&infoFile);
  bVar6 = cmGeneratorTarget::GetPropertyAsBool(target,&cfg);
  std::__cxx11::string::~string((string *)&cfg);
  GetAutogenTargetName_abi_cxx11_(&autogenTargetName,target);
  GetQtMajorVersion_abi_cxx11_(&qtMajorVersion,target);
  sources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((!bVar4 && !bVar5) && !bVar6) goto LAB_003e20a9;
  mocSkipList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mocSkipList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mocSkipList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uicSkipList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uicSkipList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uicSkipList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&cfg,"AUTOMOC",(allocator *)&infoFile);
  bVar7 = cmGeneratorTarget::GetPropertyAsBool(target,&cfg);
  std::__cxx11::string::~string((string *)&cfg);
  std::__cxx11::string::string((string *)&cfg,"AUTOUIC",(allocator *)&infoFile);
  bVar8 = cmGeneratorTarget::GetPropertyAsBool(target,&cfg);
  std::__cxx11::string::~string((string *)&cfg);
  PVar14 = cmMakefile::GetPolicyStatus(target->Makefile,CMP0071);
  srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetConfigCommonSourceFiles(target,&srcFiles);
  for (ppcVar27 = srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      ppcVar27 !=
      srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar27 = ppcVar27 + 1) {
    pcVar1 = *ppcVar27;
    psVar18 = cmSourceFile::GetExtension_abi_cxx11_(pcVar1);
    FVar15 = cmSystemTools::GetFileFormat((psVar18->_M_dataplus)._M_p);
    if ((FVar15 == CXX_FILE_FORMAT) || (FVar15 == HEADER_FILE_FORMAT)) {
      psVar18 = cmSourceFile::GetFullPath(pcVar1,(string *)0x0);
      cmsys::SystemTools::GetRealPath(&infoFile,psVar18,(string *)0x0);
      bVar9 = PropertyEnabled(pcVar1,"SKIP_AUTOGEN");
      if (bVar9) {
        bVar11 = true;
        bVar9 = false;
LAB_003e0ca1:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&mocSkipList,&infoFile);
LAB_003e0cb3:
        if (bVar11 != false) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&uicSkipList,&infoFile);
        }
        if (bVar9) {
          this_01 = &sources;
          if (FVar15 != CXX_FILE_FORMAT) {
            if (FVar15 != HEADER_FILE_FORMAT) goto LAB_003e0cf4;
            this_01 = &headers;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this_01,&infoFile);
        }
      }
      else {
        bVar10 = PropertyEnabled(pcVar1,"SKIP_AUTOMOC");
        bVar11 = PropertyEnabled(pcVar1,"SKIP_AUTOUIC");
        bVar9 = !bVar11 && bVar8 || !bVar10 && bVar7;
        if ((bVar11 || !bVar8) && (bVar10 || !bVar7)) {
LAB_003e0c9c:
          if (bVar10) goto LAB_003e0ca1;
          goto LAB_003e0cb3;
        }
        bVar12 = PropertyEnabled(pcVar1,"GENERATED");
        if ((!bVar12) || (PVar14 - NEW < 3)) goto LAB_003e0c9c;
        if (PVar14 == WARN) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cfg);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&configIncs,(cmPolicies *)0x47,id);
          poVar19 = std::operator<<((ostream *)&cfg,(string *)&configIncs);
          std::operator<<(poVar19,"\n");
          std::__cxx11::string::~string((string *)&configIncs);
          std::operator<<((ostream *)&cfg,"AUTOMOC/AUTOUIC: Ignoring GENERATED source file:\n");
          poVar19 = std::operator<<((ostream *)&cfg,"  ");
          cmQtAutoGeneratorCommon::Quoted(&configIncs,&infoFile);
          poVar19 = std::operator<<(poVar19,(string *)&configIncs);
          std::operator<<(poVar19,"\n");
          std::__cxx11::string::~string((string *)&configIncs);
          pcVar2 = target->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&configIncs);
          std::__cxx11::string::~string((string *)&configIncs);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cfg);
        }
      }
LAB_003e0cf4:
      std::__cxx11::string::~string((string *)&infoFile);
    }
  }
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  if (bVar4) {
    pcVar20 = cmGeneratorTarget::GetLocalGenerator(target);
    pcVar2 = target->Target->Makefile;
    GetSafeProperty_abi_cxx11_(&cfg,target,"AUTOMOC_MOC_OPTIONS");
    AddDefinitionEscaped(pcVar2,"_moc_options",&cfg);
    std::__cxx11::string::~string((string *)&cfg);
    AddDefinitionEscaped(pcVar2,"_moc_skip",&mocSkipList);
    std::__cxx11::string::string
              ((string *)&infoFile,"CMAKE_AUTOMOC_RELAXED_MODE",(allocator *)&configIncs);
    bVar4 = cmMakefile::IsOn(pcVar2,&infoFile);
    pcVar28 = "FALSE";
    if (bVar4) {
      pcVar28 = "TRUE";
    }
    std::__cxx11::string::string((string *)&cfg,pcVar28,(allocator *)&srcFiles);
    AddDefinitionEscaped(pcVar2,"_moc_relaxed_mode",&cfg);
    std::__cxx11::string::~string((string *)&cfg);
    std::__cxx11::string::~string((string *)&infoFile);
    GetSafeProperty_abi_cxx11_(&cfg,target,"AUTOMOC_DEPEND_FILTERS");
    AddDefinitionEscaped(pcVar2,"_moc_depend_filters",&cfg);
    std::__cxx11::string::~string((string *)&cfg);
    this_00 = target->Target->Makefile;
    configIncs._M_dataplus._M_p = (pointer)&configIncs.field_2;
    configIncs._M_string_length = 0;
    configIncs.field_2._M_allocated_capacity =
         configIncs.field_2._M_allocated_capacity & 0xffffffffffffff00;
    bVar4 = std::operator==(&qtMajorVersion,"5");
    if (bVar4) {
      std::__cxx11::string::string((string *)&cfg,"Qt5Core_VERSION_MINOR",(allocator *)&infoFile);
      cmMakefile::GetSafeDefinition(this_00,&cfg);
      std::__cxx11::string::assign((char *)&configIncs);
      std::__cxx11::string::~string((string *)&cfg);
    }
    if (configIncs._M_string_length == 0) {
      std::__cxx11::string::string((string *)&cfg,"QT_VERSION_MINOR",(allocator *)&infoFile);
      cmMakefile::GetSafeDefinition(this_00,&cfg);
      std::__cxx11::string::assign((char *)&configIncs);
      std::__cxx11::string::~string((string *)&cfg);
    }
    std::__cxx11::string::string((string *)&cfg,"QT_MINOR_VERSION",(allocator *)&srcFiles);
    std::__cxx11::string::string((string *)&infoFile,"",(allocator *)&uiFileFiles);
    pcVar28 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty(target,&cfg,&infoFile);
    std::__cxx11::string::~string((string *)&infoFile);
    std::__cxx11::string::~string((string *)&cfg);
    if (pcVar28 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&configIncs);
    }
    cfg._M_dataplus._M_p = (pointer)0x0;
    infoFile._M_dataplus._M_p = (pointer)0x0;
    bVar4 = cmSystemTools::StringToULong(qtMajorVersion._M_dataplus._M_p,(unsigned_long *)&cfg);
    if (bVar4) {
      bVar4 = cmSystemTools::StringToULong(configIncs._M_dataplus._M_p,(unsigned_long *)&infoFile);
      _Var3 = cfg._M_dataplus;
      _Var26 = infoFile._M_dataplus;
      if (!bVar4) goto LAB_003e10ca;
      if ((pointer)0x5 < cfg._M_dataplus._M_p) {
        std::__cxx11::string::~string((string *)&configIncs);
LAB_003e140e:
        std::__cxx11::string::string
                  ((string *)&infoFile,"CMAKE_CXX_COMPILER_PREDEFINES_COMMAND",
                   (allocator *)&configIncs);
        pcVar28 = cmMakefile::GetSafeDefinition(pcVar2,&infoFile);
        std::__cxx11::string::string((string *)&cfg,pcVar28,(allocator *)&srcFiles);
        AddDefinitionEscaped(pcVar2,"_moc_predefs_cmd",&cfg);
        std::__cxx11::string::~string((string *)&cfg);
        psVar18 = &infoFile;
        goto LAB_003e10cf;
      }
      std::__cxx11::string::~string((string *)&configIncs);
      if ((_Var3._M_p == (pointer)0x5) && ((pointer)0x7 < _Var26._M_p)) goto LAB_003e140e;
    }
    else {
LAB_003e10ca:
      psVar18 = &configIncs;
LAB_003e10cf:
      std::__cxx11::string::~string((string *)psVar18);
    }
    cfg._M_dataplus._M_p = (pointer)&cfg.field_2;
    cfg._M_string_length = 0;
    cfg.field_2._M_allocated_capacity = cfg.field_2._M_allocated_capacity & 0xffffffffffffff00;
    infoFile._M_dataplus._M_p = (pointer)&infoFile.field_2;
    infoFile._M_string_length = 0;
    infoFile.field_2._M_local_buf[0] = '\0';
    GetCompileDefinitionsAndDirectories(target,&config,&cfg,&infoFile);
    AddDefinitionEscaped(pcVar2,"_moc_incs",&cfg);
    AddDefinitionEscaped(pcVar2,"_moc_compile_defs",&infoFile);
    for (pbVar25 = configs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar25 !=
        configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar25 = pbVar25 + 1) {
      configIncs._M_dataplus._M_p = (pointer)&configIncs.field_2;
      configIncs._M_string_length = 0;
      configIncs.field_2._M_allocated_capacity =
           configIncs.field_2._M_allocated_capacity & 0xffffffffffffff00;
      srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)srcFiles.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      GetCompileDefinitionsAndDirectories
                (target,pbVar25,&configIncs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcFiles);
      bVar4 = std::operator!=(&configIncs,&cfg);
      if (bVar4) {
        cmOutputConverter::EscapeForCMake((string *)&uiFileFiles,&configIncs);
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&configMocIncludes,pbVar25);
        std::__cxx11::string::operator=((string *)pmVar17,(string *)&uiFileFiles);
        std::__cxx11::string::~string((string *)&uiFileFiles);
      }
      bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &srcFiles,&infoFile);
      if (bVar4) {
        cmOutputConverter::EscapeForCMake
                  ((string *)&uiFileFiles,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcFiles);
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&configMocDefines,pbVar25);
        std::__cxx11::string::operator=((string *)pmVar17,(string *)&uiFileFiles);
        std::__cxx11::string::~string((string *)&uiFileFiles);
      }
      std::__cxx11::string::~string((string *)&srcFiles);
      std::__cxx11::string::~string((string *)&configIncs);
    }
    std::__cxx11::string::~string((string *)&infoFile);
    std::__cxx11::string::~string((string *)&cfg);
    cfg._M_dataplus._M_p = (pointer)&cfg.field_2;
    cfg._M_string_length = 0;
    cfg.field_2._M_allocated_capacity = cfg.field_2._M_allocated_capacity & 0xffffffffffffff00;
    bVar4 = std::operator==(&qtMajorVersion,"5");
    if (bVar4) {
      std::__cxx11::string::string((string *)&infoFile,"Qt5::moc",(allocator *)&configIncs);
      pcVar21 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar20,&infoFile);
      std::__cxx11::string::~string((string *)&infoFile);
      if (pcVar21 != (cmGeneratorTarget *)0x0) {
        std::__cxx11::string::string((string *)&infoFile,"",(allocator *)&configIncs);
        pcVar28 = cmGeneratorTarget::ImportedGetLocation(pcVar21,&infoFile);
        goto LAB_003e138d;
      }
      std::operator+(&infoFile,"Qt5::moc target not found ",&autogenTargetName);
LAB_003e148d:
      std::__cxx11::string::operator=((string *)&cfg,(string *)&infoFile);
      std::__cxx11::string::~string((string *)&infoFile);
LAB_003e14aa:
      pcVar28 = (char *)0x0;
    }
    else {
      bVar4 = std::operator==(&qtMajorVersion,"4");
      if (!bVar4) {
        std::__cxx11::string::assign((char *)&cfg);
        std::__cxx11::string::append((string *)&cfg);
        goto LAB_003e14aa;
      }
      std::__cxx11::string::string((string *)&infoFile,"Qt4::moc",(allocator *)&configIncs);
      pcVar21 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar20,&infoFile);
      std::__cxx11::string::~string((string *)&infoFile);
      if (pcVar21 == (cmGeneratorTarget *)0x0) {
        std::operator+(&infoFile,"Qt4::moc target not found ",&autogenTargetName);
        goto LAB_003e148d;
      }
      std::__cxx11::string::string((string *)&infoFile,"",(allocator *)&configIncs);
      pcVar28 = cmGeneratorTarget::ImportedGetLocation(pcVar21,&infoFile);
LAB_003e138d:
      std::__cxx11::string::~string((string *)&infoFile);
    }
    if (cfg._M_string_length == 0) {
      pcVar29 = "";
      if (pcVar28 != (char *)0x0) {
        pcVar29 = pcVar28;
      }
      std::__cxx11::string::string((string *)&infoFile,pcVar29,(allocator *)&configIncs);
      AddDefinitionEscaped(pcVar2,"_qt_moc_executable",&infoFile);
      std::__cxx11::string::~string((string *)&infoFile);
    }
    else {
      cmSystemTools::Error(cfg._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    std::__cxx11::string::~string((string *)&cfg);
  }
  if (bVar5) {
    pcVar20 = cmGeneratorTarget::GetLocalGenerator(target);
    pcVar2 = target->Target->Makefile;
    AddDefinitionEscaped(pcVar2,"_uic_skip",&uicSkipList);
    configIncs._M_dataplus._M_p = (pointer)0x0;
    configIncs._M_string_length = 0;
    configIncs.field_2._M_allocated_capacity = 0;
    GetSafeProperty_abi_cxx11_(&cfg,target,"AUTOUIC_SEARCH_PATHS");
    cmSystemTools::ExpandListArgument
              (&cfg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&configIncs,false);
    std::__cxx11::string::~string((string *)&cfg);
    pcVar28 = cmMakefile::GetCurrentSourceDirectory(pcVar2);
    std::__cxx11::string::string((string *)&cfg,pcVar28,(allocator *)&infoFile);
    for (_Var26 = configIncs._M_dataplus; _Var26._M_p != (pointer)configIncs._M_string_length;
        _Var26._M_p = _Var26._M_p + 0x20) {
      cmsys::SystemTools::CollapseFullPath(&infoFile,(string *)_Var26._M_p,&cfg);
      std::__cxx11::string::operator=((string *)_Var26._M_p,(string *)&infoFile);
      std::__cxx11::string::~string((string *)&infoFile);
    }
    AddDefinitionEscaped
              (pcVar2,"_uic_search_paths",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&configIncs);
    std::__cxx11::string::~string((string *)&cfg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&configIncs);
    cfg._M_dataplus._M_p = (pointer)&cfg.field_2;
    cfg._M_string_length = 0;
    cfg.field_2._M_allocated_capacity = cfg.field_2._M_allocated_capacity & 0xffffffffffffff00;
    UicGetOpts(target,&config,&cfg);
    AddDefinitionEscaped(pcVar2,"_uic_target_options",&cfg);
    for (pbVar25 = configs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar25 !=
        configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar25 = pbVar25 + 1) {
      infoFile._M_string_length = 0;
      infoFile.field_2._M_local_buf[0] = '\0';
      infoFile._M_dataplus._M_p = (pointer)&infoFile.field_2;
      UicGetOpts(target,pbVar25,&infoFile);
      bVar4 = std::operator!=(&infoFile,&cfg);
      if (bVar4) {
        cmOutputConverter::EscapeForCMake(&configIncs,&infoFile);
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&configUicOptions,pbVar25);
        std::__cxx11::string::operator=((string *)pmVar17,(string *)&configIncs);
        std::__cxx11::string::~string((string *)&configIncs);
      }
      std::__cxx11::string::~string((string *)&infoFile);
    }
    std::__cxx11::string::~string((string *)&cfg);
    uiFileFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uiFileOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cfg._M_string_length = cfg._M_string_length & 0xffffffff00000000;
    cfg.field_2._M_allocated_capacity = 0;
    cfg.field_2._8_8_ = &cfg._M_string_length;
    local_3a0 = 0;
    uiFileFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uiFileFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uiFileOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uiFileOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3a8 = (size_type *)cfg.field_2._8_8_;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&cfg,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )uicSkipList.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )uicSkipList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    cmMakefile::GetQtUiFilesWithOptions(&uiFilesWithOptions,pcVar2);
    for (ppcVar27 = uiFilesWithOptions.
                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppcVar27 !=
        uiFilesWithOptions.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppcVar27 = ppcVar27 + 1) {
      pcVar1 = *ppcVar27;
      psVar18 = cmSourceFile::GetFullPath(pcVar1,(string *)0x0);
      cmsys::SystemTools::GetRealPath(&infoFile,psVar18,(string *)0x0);
      pVar30 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&cfg,&infoFile);
      if (((undefined1  [16])pVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&uiFileFiles,&infoFile);
        std::__cxx11::string::string
                  ((string *)&srcFiles,"AUTOUIC_OPTIONS",(allocator *)&rccFileFiles);
        pcVar28 = cmSourceFile::GetProperty(pcVar1,(string *)&srcFiles);
        std::__cxx11::string::string((string *)&configIncs,pcVar28,(allocator *)&rccFileOptions);
        std::__cxx11::string::~string((string *)&srcFiles);
        cmsys::SystemTools::ReplaceString(&configIncs,";",cmQtAutoGeneratorCommon::listSep);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&uiFileOptions,&configIncs);
        std::__cxx11::string::~string((string *)&configIncs);
      }
      std::__cxx11::string::~string((string *)&infoFile);
    }
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
              (&uiFilesWithOptions.
                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cfg);
    AddDefinitionEscaped(pcVar2,"_qt_uic_options_files",&uiFileFiles);
    AddDefinitionEscaped(pcVar2,"_qt_uic_options_options",&uiFileOptions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&uiFileOptions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&uiFileFiles);
    cfg._M_dataplus._M_p = (pointer)&cfg.field_2;
    cfg._M_string_length = 0;
    cfg.field_2._M_allocated_capacity = cfg.field_2._M_allocated_capacity & 0xffffffffffffff00;
    bVar4 = std::operator==(&qtMajorVersion,"5");
    if (bVar4) {
      std::__cxx11::string::string((string *)&infoFile,"Qt5::uic",(allocator *)&configIncs);
      pcVar21 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar20,&infoFile);
      std::__cxx11::string::~string((string *)&infoFile);
      if (pcVar21 == (cmGeneratorTarget *)0x0) goto LAB_003e1a6a;
      std::__cxx11::string::string((string *)&infoFile,"",(allocator *)&configIncs);
      pcVar28 = cmGeneratorTarget::ImportedGetLocation(pcVar21,&infoFile);
LAB_003e19f0:
      std::__cxx11::string::~string((string *)&infoFile);
    }
    else {
      bVar4 = std::operator==(&qtMajorVersion,"4");
      if (bVar4) {
        std::__cxx11::string::string((string *)&infoFile,"Qt4::uic",(allocator *)&configIncs);
        pcVar21 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar20,&infoFile);
        std::__cxx11::string::~string((string *)&infoFile);
        if (pcVar21 != (cmGeneratorTarget *)0x0) {
          std::__cxx11::string::string((string *)&infoFile,"",(allocator *)&configIncs);
          pcVar28 = cmGeneratorTarget::ImportedGetLocation(pcVar21,&infoFile);
          goto LAB_003e19f0;
        }
        psVar18 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        std::operator+(&infoFile,"Qt4::uic target not found ",psVar18);
        std::__cxx11::string::operator=((string *)&cfg,(string *)&infoFile);
        std::__cxx11::string::~string((string *)&infoFile);
      }
      else {
        std::__cxx11::string::assign((char *)&cfg);
        cmGeneratorTarget::GetName_abi_cxx11_(target);
        std::__cxx11::string::append((string *)&cfg);
      }
LAB_003e1a6a:
      pcVar28 = (char *)0x0;
    }
    if (cfg._M_string_length == 0) {
      pcVar29 = "";
      if (pcVar28 != (char *)0x0) {
        pcVar29 = pcVar28;
      }
      std::__cxx11::string::string((string *)&infoFile,pcVar29,(allocator *)&configIncs);
      AddDefinitionEscaped(pcVar2,"_qt_uic_executable",&infoFile);
      std::__cxx11::string::~string((string *)&infoFile);
    }
    else {
      cmSystemTools::Error(cfg._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    std::__cxx11::string::~string((string *)&cfg);
  }
  if (bVar6) {
    pcVar2 = target->Target->Makefile;
    bVar4 = std::operator==(&qtMajorVersion,"5");
    RccGetExecutable(&infoFile,target,&qtMajorVersion);
    uiFileOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uiFileOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uiFileOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uiFilesWithOptions.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    uiFilesWithOptions.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uiFilesWithOptions.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rccFileFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rccFileFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rccFileFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rccFileOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rccFileOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rccFileOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rccOptionsTarget.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rccOptionsTarget.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rccOptionsTarget.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&cfg,"AUTORCC_OPTIONS",(allocator *)&configIncs);
    pcVar28 = cmGeneratorTarget::GetProperty(target,&cfg);
    std::__cxx11::string::~string((string *)&cfg);
    if (pcVar28 != (char *)0x0) {
      std::__cxx11::string::string((string *)&cfg,pcVar28,(allocator *)&configIncs);
      cmSystemTools::ExpandListArgument(&cfg,&rccOptionsTarget,false);
      std::__cxx11::string::~string((string *)&cfg);
    }
    srcFiles_1.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    srcFiles_1.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    srcFiles_1.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetConfigCommonSourceFiles(target,&srcFiles_1);
    for (ppcVar27 = srcFiles_1.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        ppcVar27 !=
        srcFiles_1.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar27 = ppcVar27 + 1) {
      pcVar1 = *ppcVar27;
      psVar18 = cmSourceFile::GetExtension_abi_cxx11_(pcVar1);
      bVar5 = std::operator==(psVar18,"qrc");
      if (bVar5) {
        bVar5 = PropertyEnabled(pcVar1,"SKIP_AUTOGEN");
        if (!bVar5) {
          bVar5 = PropertyEnabled(pcVar1,"SKIP_AUTORCC");
          if (!bVar5) {
            psVar18 = cmSourceFile::GetFullPath(pcVar1,(string *)0x0);
            cmsys::SystemTools::GetRealPath(&configIncs,psVar18,(string *)0x0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&uiFileOptions,&configIncs);
            std::__cxx11::string::string((string *)&cfg,"{",(allocator *)&srcFiles);
            bVar5 = PropertyEnabled(pcVar1,"GENERATED");
            if (!bVar5) {
              srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&srcFiles.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)srcFiles.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffffffffff00);
              files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              bVar5 = cmQtAutoGeneratorCommon::RccListInputs
                                (&qtMajorVersion,&infoFile,&configIncs,&files,(string *)&srcFiles);
              if (bVar5) {
                cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((string *)&uiFileFiles,&files,cmQtAutoGeneratorCommon::listSep);
                std::__cxx11::string::append((string *)&cfg);
                std::__cxx11::string::~string((string *)&uiFileFiles);
              }
              else {
                cmSystemTools::Error
                          ((char *)srcFiles.
                                   super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start,(char *)0x0,(char *)0x0
                           ,(char *)0x0);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&files);
              std::__cxx11::string::~string((string *)&srcFiles);
            }
            std::__cxx11::string::append((char *)&cfg);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&uiFilesWithOptions,&cfg);
            std::__cxx11::string::~string((string *)&cfg);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&uiFileFiles,&rccOptionsTarget);
            std::__cxx11::string::string((string *)&cfg,"AUTORCC_OPTIONS",(allocator *)&srcFiles);
            pcVar28 = cmSourceFile::GetProperty(pcVar1,&cfg);
            std::__cxx11::string::~string((string *)&cfg);
            if (pcVar28 != (char *)0x0) {
              files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::__cxx11::string::string((string *)&cfg,pcVar28,(allocator *)&srcFiles);
              cmSystemTools::ExpandListArgument(&cfg,&files,false);
              std::__cxx11::string::~string((string *)&cfg);
              srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              for (__x = files.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                  __x != files.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
                _Var22 = std::
                         __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                   (uiFileFiles.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    uiFileFiles.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,__x);
                if (_Var22._M_current ==
                    uiFileFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&srcFiles,__x);
                }
                else {
                  pcVar28 = (__x->_M_dataplus)._M_p;
                  if (*pcVar28 == '-') {
                    pcVar29 = pcVar28 + 1;
                    if ((bVar4) && (pcVar28[1] == '-')) {
                      pcVar29 = pcVar28 + 2;
                    }
                    cmStrCmp::cmStrCmp((cmStrCmp *)&cfg,pcVar29);
                    ppcVar23 = std::find_if<char_const*const*,cmStrCmp>
                                         ((char **)
                                                  RccMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                                                  ::valueOptions,&cmQtAutoGeneratorCommon::listSep,
                                          (cmStrCmp *)&cfg);
                    std::__cxx11::string::~string((string *)&cfg);
                    if (((ppcVar23 != &cmQtAutoGeneratorCommon::listSep) &&
                        (_Var22._M_current + 1 !=
                         uiFileFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)) &&
                       (__x + 1 !=
                        files.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)) {
                      std::__cxx11::string::_M_assign((string *)(_Var22._M_current + 1));
                      __x = __x + 1;
                    }
                  }
                }
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &uiFileFiles,
                         (const_iterator)
                         uiFileFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )srcFiles.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )srcFiles.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&srcFiles);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&files);
            }
            if (uiFileFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                uiFileFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&rccFileFiles,&configIncs);
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (&cfg,&uiFileFiles,cmQtAutoGeneratorCommon::listSep);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &rccFileOptions,&cfg);
              std::__cxx11::string::~string((string *)&cfg);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&uiFileFiles);
            std::__cxx11::string::~string((string *)&configIncs);
          }
        }
      }
    }
    AddDefinitionEscaped(pcVar2,"_qt_rcc_executable",&infoFile);
    AddDefinitionEscaped(pcVar2,"_rcc_files",&uiFileOptions);
    AddDefinitionEscaped
              (pcVar2,"_rcc_inputs",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&uiFilesWithOptions);
    AddDefinitionEscaped(pcVar2,"_rcc_options_files",&rccFileFiles);
    AddDefinitionEscaped(pcVar2,"_rcc_options_options",&rccFileOptions);
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
              (&srcFiles_1.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&rccOptionsTarget);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&rccFileOptions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&rccFileFiles);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&uiFilesWithOptions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&uiFileOptions);
    std::__cxx11::string::~string((string *)&infoFile);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&uicSkipList);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&mocSkipList);
LAB_003e20a9:
  GetAutogenTargetBuildDir_abi_cxx11_(&cfg,target);
  AddDefinitionEscaped(this,"_autogen_build_dir",&cfg);
  std::__cxx11::string::~string((string *)&cfg);
  AddDefinitionEscaped(this,"_qt_version_major",&qtMajorVersion);
  AddDefinitionEscaped(this,"_sources",&sources);
  AddDefinitionEscaped(this,"_headers",&headers);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&headers);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sources);
  std::__cxx11::string::~string((string *)&qtMajorVersion);
  std::__cxx11::string::~string((string *)&autogenTargetName);
  GetAutogenTargetFilesDir_abi_cxx11_(&infoFile,target);
  std::__cxx11::string::append((char *)&infoFile);
  psVar18 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::__cxx11::string::string((string *)&cfg,(string *)psVar18);
  std::__cxx11::string::append((char *)&cfg);
  _Var3 = cfg._M_dataplus;
  _Var26 = infoFile._M_dataplus;
  cmNewLineStyle::cmNewLineStyle(&local_47c);
  cmMakefile::ConfigureFile(this,_Var3._M_p,_Var26._M_p,false,true,false,local_47c);
  std::__cxx11::string::~string((string *)&cfg);
  if ((((configSuffix._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) ||
       (configMocDefines._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
      (configMocIncludes._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
     (configUicOptions._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    uiFileFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)uiFileFiles.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    cmsys::SystemTools::GetPermissions(&infoFile,(mode_t *)&uiFileFiles);
    if (-1 < (char)uiFileFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
      cmsys::SystemTools::SetPermissions
                (&infoFile,
                 (uint)uiFileFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start | 0x80,false);
    }
    std::ofstream::ofstream(&cfg,infoFile._M_dataplus._M_p,_S_app);
    if ((*(byte *)((long)&local_3a8 + *(long *)(cfg._M_dataplus._M_p + -0x18)) & 5) == 0) {
      std::operator<<((ostream *)&cfg,"# Configuration specific options\n");
      for (p_Var24 = configSuffix._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var24 != &configSuffix._M_t._M_impl.super__Rb_tree_header;
          p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
        poVar19 = std::operator<<((ostream *)&cfg,"set(AM_CONFIG_SUFFIX_");
        poVar19 = std::operator<<(poVar19,(string *)(p_Var24 + 1));
        poVar19 = std::operator<<(poVar19," ");
        poVar19 = std::operator<<(poVar19,(string *)(p_Var24 + 2));
        std::operator<<(poVar19,")\n");
      }
      for (p_Var24 = configMocDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var24 != &configMocDefines._M_t._M_impl.super__Rb_tree_header;
          p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
        poVar19 = std::operator<<((ostream *)&cfg,"set(AM_MOC_DEFINITIONS_");
        poVar19 = std::operator<<(poVar19,(string *)(p_Var24 + 1));
        poVar19 = std::operator<<(poVar19," ");
        poVar19 = std::operator<<(poVar19,(string *)(p_Var24 + 2));
        std::operator<<(poVar19,")\n");
      }
      for (p_Var24 = configMocIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var24 != &configMocIncludes._M_t._M_impl.super__Rb_tree_header;
          p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
        poVar19 = std::operator<<((ostream *)&cfg,"set(AM_MOC_INCLUDES_");
        poVar19 = std::operator<<(poVar19,(string *)(p_Var24 + 1));
        poVar19 = std::operator<<(poVar19," ");
        poVar19 = std::operator<<(poVar19,(string *)(p_Var24 + 2));
        std::operator<<(poVar19,")\n");
      }
      for (p_Var24 = configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var24 != &configUicOptions._M_t._M_impl.super__Rb_tree_header;
          p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
        poVar19 = std::operator<<((ostream *)&cfg,"set(AM_UIC_TARGET_OPTIONS_");
        poVar19 = std::operator<<(poVar19,(string *)(p_Var24 + 1));
        poVar19 = std::operator<<(poVar19," ");
        poVar19 = std::operator<<(poVar19,(string *)(p_Var24 + 2));
        std::operator<<(poVar19,")\n");
      }
    }
    else {
      std::__cxx11::string::string
                ((string *)&configIncs,"Internal CMake error when trying to open file: ",
                 (allocator *)&srcFiles);
      cmQtAutoGeneratorCommon::Quoted((string *)&srcFiles,&infoFile);
      std::__cxx11::string::append((string *)&configIncs);
      std::__cxx11::string::~string((string *)&srcFiles);
      std::__cxx11::string::append((char *)&configIncs);
      cmSystemTools::Error(configIncs._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)&configIncs);
    }
    std::ofstream::~ofstream(&cfg);
  }
  std::__cxx11::string::~string((string *)&infoFile);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&configUicOptions._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&configMocDefines._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&configMocIncludes._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&configSuffix._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  std::__cxx11::string::~string((string *)&config);
  cmMakefile::ScopePushPop::~ScopePushPop(&varScope);
  return;
}

Assistant:

void cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(
  cmGeneratorTarget const* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();

  // forget the variables added here afterwards again:
  cmMakefile::ScopePushPop varScope(makefile);
  static_cast<void>(varScope);

  // Get configurations
  std::string config;
  const std::vector<std::string> configs(GetConfigurations(makefile, &config));

  // Configurations settings buffers
  std::map<std::string, std::string> configSuffix;
  std::map<std::string, std::string> configMocIncludes;
  std::map<std::string, std::string> configMocDefines;
  std::map<std::string, std::string> configUicOptions;

  // Configuration suffix
  if (IsMultiConfig(target->GetGlobalGenerator())) {
    for (std::vector<std::string>::const_iterator it = configs.begin();
         it != configs.end(); ++it) {
      configSuffix[*it] = cmOutputConverter::EscapeForCMake("_" + *it);
    }
  }

  // Basic setup
  {
    const bool mocEnabled = target->GetPropertyAsBool("AUTOMOC");
    const bool uicEnabled = target->GetPropertyAsBool("AUTOUIC");
    const bool rccEnabled = target->GetPropertyAsBool("AUTORCC");
    const std::string autogenTargetName = GetAutogenTargetName(target);
    const std::string qtMajorVersion = GetQtMajorVersion(target);

    std::vector<std::string> sources;
    std::vector<std::string> headers;

    if (mocEnabled || uicEnabled || rccEnabled) {
      std::vector<std::string> mocSkipList;
      std::vector<std::string> uicSkipList;
      AcquireScanFiles(target, sources, headers, mocSkipList, uicSkipList);
      if (mocEnabled) {
        MocSetupAutoTarget(target, autogenTargetName, qtMajorVersion, config,
                           configs, mocSkipList, configMocIncludes,
                           configMocDefines);
      }
      if (uicEnabled) {
        UicSetupAutoTarget(target, qtMajorVersion, config, configs,
                           uicSkipList, configUicOptions);
      }
      if (rccEnabled) {
        RccSetupAutoTarget(target, qtMajorVersion);
      }
    }

    AddDefinitionEscaped(makefile, "_autogen_build_dir",
                         GetAutogenTargetBuildDir(target));
    AddDefinitionEscaped(makefile, "_qt_version_major", qtMajorVersion);
    AddDefinitionEscaped(makefile, "_sources", sources);
    AddDefinitionEscaped(makefile, "_headers", headers);
  }

  // Generate info file
  std::string infoFile = GetAutogenTargetFilesDir(target);
  infoFile += "/AutogenInfo.cmake";
  {
    std::string inf = cmSystemTools::GetCMakeRoot();
    inf += "/Modules/AutogenInfo.cmake.in";
    makefile->ConfigureFile(inf.c_str(), infoFile.c_str(), false, true, false);
  }

  // Append custom definitions to info file on demand
  if (!configSuffix.empty() || !configMocDefines.empty() ||
      !configMocIncludes.empty() || !configUicOptions.empty()) {

    // Ensure we have write permission in case .in was read-only.
    mode_t perm = 0;
#if defined(_WIN32) && !defined(__CYGWIN__)
    mode_t mode_write = S_IWRITE;
#else
    mode_t mode_write = S_IWUSR;
#endif
    cmSystemTools::GetPermissions(infoFile, perm);
    if (!(perm & mode_write)) {
      cmSystemTools::SetPermissions(infoFile, perm | mode_write);
    }

    // Open and write file
    cmsys::ofstream ofs(infoFile.c_str(), std::ios::app);
    if (ofs) {
      ofs << "# Configuration specific options\n";
      for (std::map<std::string, std::string>::iterator
             it = configSuffix.begin(),
             end = configSuffix.end();
           it != end; ++it) {
        ofs << "set(AM_CONFIG_SUFFIX_" << it->first << " " << it->second
            << ")\n";
      }
      for (std::map<std::string, std::string>::iterator
             it = configMocDefines.begin(),
             end = configMocDefines.end();
           it != end; ++it) {
        ofs << "set(AM_MOC_DEFINITIONS_" << it->first << " " << it->second
            << ")\n";
      }
      for (std::map<std::string, std::string>::iterator
             it = configMocIncludes.begin(),
             end = configMocIncludes.end();
           it != end; ++it) {
        ofs << "set(AM_MOC_INCLUDES_" << it->first << " " << it->second
            << ")\n";
      }
      for (std::map<std::string, std::string>::iterator
             it = configUicOptions.begin(),
             end = configUicOptions.end();
           it != end; ++it) {
        ofs << "set(AM_UIC_TARGET_OPTIONS_" << it->first << " " << it->second
            << ")\n";
      }
    } else {
      // File open error
      std::string error = "Internal CMake error when trying to open file: ";
      error += cmQtAutoGeneratorCommon::Quoted(infoFile);
      error += " for writing.";
      cmSystemTools::Error(error.c_str());
    }
  }
}